

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O0

QPDFFileSpecObjectHelper *
QPDFFileSpecObjectHelper::createFileSpec
          (QPDFFileSpecObjectHelper *__return_storage_ptr__,QPDF *qpdf,string *filename,
          QPDFEFStreamObjectHelper *efsoh)

{
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [24];
  string local_158;
  undefined1 local_138 [24];
  string local_120;
  undefined1 local_100 [8];
  QPDFObjectHandle ef;
  string local_e8;
  QPDFObjectHandle local_c8;
  byte local_b2;
  allocator<char> local_b1;
  string local_b0;
  QPDFObjectHandle local_90;
  allocator<char> local_79;
  string local_78;
  QPDFObjectHandle local_48;
  undefined1 local_38 [8];
  QPDFObjectHandle oh;
  QPDFEFStreamObjectHelper *efsoh_local;
  string *filename_local;
  QPDF *qpdf_local;
  QPDFFileSpecObjectHelper *result;
  
  oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)efsoh;
  QPDFObjectHandle::newDictionary();
  QPDF::makeIndirectObject((QPDF *)local_38,(QPDFObjectHandle *)qpdf);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/Type",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/Filespec",&local_b1);
  QPDFObjectHandle::newName(&local_90,&local_b0);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_38,&local_78,&local_90);
  QPDFObjectHandle::~QPDFObjectHandle(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_b2 = 0;
  QPDFObjectHandle::QPDFObjectHandle(&local_c8,(QPDFObjectHandle *)local_38);
  QPDFFileSpecObjectHelper(__return_storage_ptr__,&local_c8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"",
             (allocator<char> *)
             ((long)&ef.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  setFilename(__return_storage_ptr__,filename,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ef.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"/F",(allocator<char> *)(local_138 + 0x17));
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_138);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_100,&local_120,(QPDFObjectHandle *)local_138);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_138);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)(local_138 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"/UF",(allocator<char> *)(local_170 + 0x17));
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_170);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_100,&local_158,(QPDFObjectHandle *)local_170);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_170);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)(local_170 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"/EF",&local_191);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_38,&local_190,(QPDFObjectHandle *)local_100);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  local_b2 = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
  if ((local_b2 & 1) == 0) {
    ~QPDFFileSpecObjectHelper(__return_storage_ptr__);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  return __return_storage_ptr__;
}

Assistant:

QPDFFileSpecObjectHelper
QPDFFileSpecObjectHelper::createFileSpec(
    QPDF& qpdf, std::string const& filename, QPDFEFStreamObjectHelper efsoh)
{
    auto oh = qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
    oh.replaceKey("/Type", QPDFObjectHandle::newName("/Filespec"));
    QPDFFileSpecObjectHelper result(oh);
    result.setFilename(filename);
    auto ef = QPDFObjectHandle::newDictionary();
    ef.replaceKey("/F", efsoh.getObjectHandle());
    ef.replaceKey("/UF", efsoh.getObjectHandle());
    oh.replaceKey("/EF", ef);
    return result;
}